

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c++
# Opt level: O0

bool capnp::compiler::lex(ArrayPtr<const_char> input,Builder result,ErrorReporter *errorReporter)

{
  Builder builder;
  undefined1 auVar1 [32];
  uint32_t uVar2;
  Parsers *pPVar3;
  char *begin;
  char *end;
  size_t sVar4;
  ulong uVar5;
  Orphan<capnp::compiler::Token> *pOVar6;
  Wrapper *pWVar7;
  char (*params) [13];
  Orphanage orphanageParam;
  undefined8 in_stack_fffffffffffffdd0;
  String local_1c0;
  StringPtr local_1a8;
  uint32_t local_194;
  undefined4 local_190;
  uint32_t best;
  undefined1 local_188 [4];
  uint i;
  Builder l;
  Array<capnp::Orphan<capnp::compiler::Token>_> *output;
  Maybe<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> parseOutput;
  ParserInput parserInput;
  undefined1 local_100 [8];
  Sequence_<const_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&,_const_kj::parse::EndOfInput__&>
  parser;
  undefined1 local_a8 [8];
  Lexer lexer;
  ErrorReporter *errorReporter_local;
  ArrayPtr<const_char> input_local;
  
  input_local.ptr = (char *)input.size_;
  errorReporter_local = (ErrorReporter *)input.ptr;
  parser.rest._8_8_ = result._builder.segment;
  auVar1 = result._builder._8_32_;
  builder._builder._32_8_ = in_stack_fffffffffffffdd0;
  builder._builder.segment = (SegmentBuilder *)auVar1._0_8_;
  builder._builder.capTable = (CapTableBuilder *)auVar1._8_8_;
  builder._builder.data = (void *)auVar1._16_8_;
  builder._builder.pointers = (WirePointer *)auVar1._24_8_;
  lexer.parsers.statementSequence.wrapper = (Wrapper *)errorReporter;
  orphanageParam =
       Orphanage::getForMessageContaining<capnp::compiler::LexedTokens::Builder>(builder);
  pWVar7 = lexer.parsers.statementSequence.wrapper;
  Lexer::Lexer((Lexer *)local_a8,orphanageParam,
               (ErrorReporter *)lexer.parsers.statementSequence.wrapper);
  pPVar3 = Lexer::getParsers((Lexer *)local_a8);
  kj::parse::
  sequence<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>const&,kj::parse::EndOfInput_const&>
            ((Sequence_<const_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&,_const_kj::parse::EndOfInput__&>
              *)local_100,(parse *)&pPVar3->tokenSequence,
             (ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>
              *)&kj::parse::endOfInput,(EndOfInput_ *)pWVar7);
  begin = kj::ArrayPtr<const_char>::begin((ArrayPtr<const_char> *)&errorReporter_local);
  end = kj::ArrayPtr<const_char>::end((ArrayPtr<const_char> *)&errorReporter_local);
  Lexer::ParserInput::ParserInput((ParserInput *)((long)&parseOutput.ptr.field_1 + 0x10),begin,end);
  kj::parse::
  Sequence_<const_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&,_const_kj::parse::EndOfInput__&>
  ::operator()<capnp::compiler::Lexer::ParserInput>
            ((Maybe<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> *)&output,
             (Sequence_<const_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&,_const_kj::parse::EndOfInput__&>
              *)local_100,(ParserInput *)((long)&parseOutput.ptr.field_1 + 0x10));
  l.builder._32_8_ =
       kj::_::readMaybe<kj::Array<capnp::Orphan<capnp::compiler::Token>>>
                 ((Maybe<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> *)&output);
  if ((Array<capnp::Orphan<capnp::compiler::Token>_> *)l.builder._32_8_ ==
      (Array<capnp::Orphan<capnp::compiler::Token>_> *)0x0) {
    uVar2 = Lexer::ParserInput::getBest((ParserInput *)((long)&parseOutput.ptr.field_1 + 0x10));
    pWVar7 = lexer.parsers.statementSequence.wrapper;
    local_194 = uVar2;
    kj::str<char_const(&)[13]>(&local_1c0,(kj *)"Parse error.",params);
    kj::StringPtr::StringPtr(&local_1a8,&local_1c0);
    (*(code *)**(undefined8 **)pWVar7)
              (pWVar7,uVar2,uVar2,local_1a8.content.ptr,local_1a8.content.size_);
    kj::String::~String(&local_1c0);
    input_local.size_._7_1_ = 0;
  }
  else {
    sVar4 = kj::Array<capnp::Orphan<capnp::compiler::Token>_>::size
                      ((Array<capnp::Orphan<capnp::compiler::Token>_> *)l.builder._32_8_);
    LexedTokens::Builder::initTokens((Builder *)local_188,&result,(uint)sVar4);
    best = 0;
    while( true ) {
      uVar5 = (ulong)best;
      sVar4 = kj::Array<capnp::Orphan<capnp::compiler::Token>_>::size
                        ((Array<capnp::Orphan<capnp::compiler::Token>_> *)l.builder._32_8_);
      uVar2 = best;
      if (sVar4 <= uVar5) break;
      pOVar6 = kj::Array<capnp::Orphan<capnp::compiler::Token>_>::operator[]
                         ((Array<capnp::Orphan<capnp::compiler::Token>_> *)l.builder._32_8_,
                          (ulong)best);
      pOVar6 = kj::mv<capnp::Orphan<capnp::compiler::Token>>(pOVar6);
      List<capnp::compiler::Token,_(capnp::Kind)3>::Builder::adoptWithCaveats
                ((Builder *)local_188,uVar2,pOVar6);
      best = best + 1;
    }
    input_local.size_._7_1_ = 1;
  }
  local_190 = 1;
  kj::Maybe<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>::~Maybe
            ((Maybe<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> *)&output);
  Lexer::ParserInput::~ParserInput((ParserInput *)((long)&parseOutput.ptr.field_1 + 0x10));
  Lexer::~Lexer((Lexer *)local_a8);
  return (bool)(input_local.size_._7_1_ & 1);
}

Assistant:

bool lex(kj::ArrayPtr<const char> input, LexedTokens::Builder result,
         ErrorReporter& errorReporter) {
  Lexer lexer(Orphanage::getForMessageContaining(result), errorReporter);

  auto parser = p::sequence(lexer.getParsers().tokenSequence, p::endOfInput);

  Lexer::ParserInput parserInput(input.begin(), input.end());
  kj::Maybe<kj::Array<Orphan<Token>>> parseOutput = parser(parserInput);

  KJ_IF_MAYBE(output, parseOutput) {
    auto l = result.initTokens(output->size());
    for (uint i = 0; i < output->size(); i++) {
      l.adoptWithCaveats(i, kj::mv((*output)[i]));
    }
    return true;
  } else {
    uint32_t best = parserInput.getBest();
    errorReporter.addError(best, best, kj::str("Parse error."));
    return false;
  }